

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O1

void __thiscall duckdb::Statement::Statement(Statement *this,SQLLogicTestRunner *runner)

{
  (this->super_Command).runner = runner;
  (this->super_Command).connection_name._M_dataplus._M_p =
       (pointer)&(this->super_Command).connection_name.field_2;
  (this->super_Command).connection_name._M_string_length = 0;
  (this->super_Command).connection_name.field_2._M_local_buf[0] = '\0';
  (this->super_Command).base_sql_query._M_dataplus._M_p =
       (pointer)&(this->super_Command).base_sql_query.field_2;
  (this->super_Command).base_sql_query._M_string_length = 0;
  (this->super_Command).base_sql_query.field_2._M_local_buf[0] = '\0';
  (this->super_Command).file_name._M_dataplus._M_p =
       (pointer)&(this->super_Command).file_name.field_2;
  (this->super_Command).file_name._M_string_length = 0;
  (this->super_Command).file_name.field_2._M_local_buf[0] = '\0';
  (this->super_Command).conditions.
  super_vector<duckdb::Condition,_std::allocator<duckdb::Condition>_>.
  super__Vector_base<duckdb::Condition,_std::allocator<duckdb::Condition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Command).conditions.
  super_vector<duckdb::Condition,_std::allocator<duckdb::Condition>_>.
  super__Vector_base<duckdb::Condition,_std::allocator<duckdb::Condition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Command).conditions.
  super_vector<duckdb::Condition,_std::allocator<duckdb::Condition>_>.
  super__Vector_base<duckdb::Condition,_std::allocator<duckdb::Condition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Command)._vptr_Command = (_func_int **)&PTR__Statement_005dbc10;
  (this->expected_error)._M_dataplus._M_p = (pointer)&(this->expected_error).field_2;
  (this->expected_error)._M_string_length = 0;
  (this->expected_error).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Command::Command(SQLLogicTestRunner &runner) : runner(runner) {
}